

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recipient.c
# Opt level: O1

HCOSE_RECIPIENT
COSE_Recipient_from_shared_secret(byte *rgbKey,int cbKey,byte *rgbKid,int cbKid,cose_errback *perr)

{
  _Bool _Var1;
  HCOSE_RECIPIENT hRecipient;
  
  hRecipient = COSE_Recipient_Init(COSE_INIT_FLAGS_NONE,perr);
  if (hRecipient != (HCOSE_RECIPIENT)0x0) {
    _Var1 = COSE_Recipient_SetKey_secret(hRecipient,rgbKey,cbKey,rgbKid,cbKid,perr);
    if (_Var1) {
      return hRecipient;
    }
    COSE_Recipient_Free(hRecipient);
  }
  return (HCOSE_RECIPIENT)0x0;
}

Assistant:

HCOSE_RECIPIENT COSE_Recipient_from_shared_secret(byte * rgbKey, int cbKey, byte * rgbKid, int cbKid, CBOR_CONTEXT_COMMA cose_errback * perr)
{
	HCOSE_RECIPIENT hRecipient = NULL;

	hRecipient = COSE_Recipient_Init(0, CBOR_CONTEXT_PARAM_COMMA perr);
	if (hRecipient == NULL) goto errorReturn;

	if (!COSE_Recipient_SetKey_secret(hRecipient, rgbKey, cbKey, rgbKid, cbKid, perr)) goto errorReturn;

	return hRecipient;

errorReturn:
	if (hRecipient != NULL) COSE_Recipient_Free(hRecipient);
	return NULL;
}